

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O3

int safe_strncmp(csafestring_t *obj,char *str,size_t size)

{
  int iVar1;
  size_t sVar2;
  size_t length;
  
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    if (obj->buffer_length < size) {
      size = obj->buffer_length;
    }
    if (sVar2 < size) {
      size = sVar2;
    }
    iVar1 = strncmp(obj->data,str,size);
    return iVar1;
  }
  return 1;
}

Assistant:

int safe_strncmp(csafestring_t *obj, const char *str, size_t size) {

	size_t length = size;
	if ( str == NULL ) {
		return 1;
	}

	size_t strLength = strlen(str);

	if ( obj->buffer_length < length ) {
		length = obj->buffer_length;
	}

	if ( strLength < length ) {
		length = strLength;
	}

	return strncmp(obj->data, str, length);
}